

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_metadata.cpp
# Opt level: O1

void duckdb::ParquetMetaDataImplementation<(duckdb::ParquetMetadataOperatorType)0>
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  ParquetMetaDataOperatorData *this;
  long lVar1;
  char cVar2;
  MultiFileList *pMVar3;
  
  optional_ptr<duckdb::GlobalTableFunctionState,_true>::CheckValid
            ((optional_ptr<duckdb::GlobalTableFunctionState,_true> *)(data_p + 0x10));
  this = *(ParquetMetaDataOperatorData **)(data_p + 0x10);
  optional_ptr<const_duckdb::FunctionData,_true>::CheckValid
            ((optional_ptr<const_duckdb::FunctionData,_true> *)data_p);
  lVar1 = *(long *)data_p;
  do {
    while (cVar2 = duckdb::ColumnDataCollection::Scan
                             ((ColumnDataScanState *)&this->collection,
                              (DataChunk *)&this->scan_state), cVar2 == '\0') {
      pMVar3 = shared_ptr<duckdb::MultiFileList,_true>::operator->
                         ((shared_ptr<duckdb::MultiFileList,_true> *)(lVar1 + 0x38));
      cVar2 = duckdb::MultiFileList::Scan
                        ((MultiFileListScanData *)pMVar3,(OpenFileInfo *)&this->file_list_scan);
      if (cVar2 == '\0') {
        return;
      }
      ParquetMetaDataOperatorData::LoadRowGroupMetadata
                (this,context,(vector<duckdb::LogicalType,_true> *)(lVar1 + 0x20),
                 &this->current_file);
    }
  } while (*(long *)(output + 0x18) == 0);
  return;
}

Assistant:

void ParquetMetaDataImplementation(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &data = data_p.global_state->Cast<ParquetMetaDataOperatorData>();
	auto &bind_data = data_p.bind_data->Cast<ParquetMetaDataBindData>();

	while (true) {
		if (!data.collection.Scan(data.scan_state, output)) {

			// Try get next file
			if (!bind_data.file_list->Scan(data.file_list_scan, data.current_file)) {
				return;
			}

			switch (TYPE) {
			case ParquetMetadataOperatorType::SCHEMA:
				data.LoadSchemaData(context, bind_data.return_types, data.current_file);
				break;
			case ParquetMetadataOperatorType::META_DATA:
				data.LoadRowGroupMetadata(context, bind_data.return_types, data.current_file);
				break;
			case ParquetMetadataOperatorType::KEY_VALUE_META_DATA:
				data.LoadKeyValueMetaData(context, bind_data.return_types, data.current_file);
				break;
			case ParquetMetadataOperatorType::FILE_META_DATA:
				data.LoadFileMetaData(context, bind_data.return_types, data.current_file);
				break;
			case ParquetMetadataOperatorType::BLOOM_PROBE: {
				auto &bloom_probe_bind_data = data_p.bind_data->Cast<ParquetBloomProbeBindData>();
				data.ExecuteBloomProbe(context, bind_data.return_types, data.current_file,
				                       bloom_probe_bind_data.probe_column_name, bloom_probe_bind_data.probe_constant);
				break;
			}
			default:
				throw InternalException("Unsupported ParquetMetadataOperatorType");
			}
			continue;
		}
		if (output.size() != 0) {
			return;
		}
	}
}